

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O0

Argument * __thiscall
dg::vr::ValueRelations::getInstance<llvm::Argument>(ValueRelations *this,Handle h)

{
  bool bVar1;
  Argument *inst;
  Value *val;
  const_iterator __end3;
  const_iterator __begin3;
  VectorSet<const_llvm::Value_*> *__range3;
  VectorSet<const_llvm::Value_*> *in_stack_ffffffffffffffb8;
  ret_type in_stack_ffffffffffffffc0;
  Handle in_stack_ffffffffffffffc8;
  ValueRelations *in_stack_ffffffffffffffd0;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_28;
  VectorSet<const_llvm::Value_*> *local_20;
  
  local_20 = getEqual(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  local_28._M_current = (Value **)VectorSet<const_llvm::Value_*>::begin(in_stack_ffffffffffffffb8);
  VectorSet<const_llvm::Value_*>::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) {
      return (Argument *)0x0;
    }
    __gnu_cxx::
    __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
    ::operator*(&local_28);
    in_stack_ffffffffffffffc0 =
         llvm::dyn_cast<llvm::Argument,llvm::Value_const>((Value *)in_stack_ffffffffffffffc0);
    if (in_stack_ffffffffffffffc0 != (ret_type)0x0) break;
    __gnu_cxx::
    __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
    ::operator++(&local_28);
  }
  return in_stack_ffffffffffffffc0;
}

Assistant:

const I *getInstance(Handle h) const {
        for (const auto *val : getEqual(h)) {
            if (const auto *inst = llvm::dyn_cast<I>(val))
                return inst;
        }
        return nullptr;
    }